

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPort::~IfcPort(IfcPort *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x8a3f58;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x8a3fd0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x8a3f80;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8a3fa8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x8a4070;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x8a4098;
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcPort() : Object("IfcPort") {}